

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O1

void __thiscall CLI::Error::Error(Error *this,string *name,string *msg,ExitCodes exit_code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar2 = (name->_M_dataplus)._M_p;
  local_68 = &local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
  pcVar2 = (msg->_M_dataplus)._M_p;
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + msg->_M_string_length);
  ::std::runtime_error::runtime_error((runtime_error *)this,(string *)local_48);
  *(undefined ***)this = &PTR__Error_001346a0;
  this->actual_exit_code = exit_code;
  paVar1 = &(this->error_name).field_2;
  (this->error_name)._M_dataplus._M_p = (pointer)paVar1;
  if (local_68 == &local_58) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_57,local_58);
    *(undefined8 *)((long)&(this->error_name).field_2 + 8) = uStack_50;
  }
  else {
    (this->error_name)._M_dataplus._M_p = local_68;
    (this->error_name).field_2._M_allocated_capacity = CONCAT71(uStack_57,local_58);
  }
  (this->error_name)._M_string_length = local_60;
  local_60 = 0;
  local_58 = '\0';
  local_68 = &local_58;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

Error(std::string name, std::string msg, ExitCodes exit_code) : Error(name, msg, static_cast<int>(exit_code)) {}